

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::factor(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this,SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               **vec,
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *threshold,
        number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
        *eps)

{
  Status SVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_118;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_78;
  
  (*this->factorTime->_vptr_Timer[3])();
  this->stat = OK;
  *(this->l).start = 0;
  (this->l).firstUpdate = 0;
  (this->l).firstUnused = 0;
  Temp::init(&this->temp,(EVP_PKEY_CTX *)(ulong)(uint)this->thedim);
  initPerm(this);
  local_78.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
  local_78.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
  local_78.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
  local_78.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
  local_78.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
  local_78.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10);
  local_78.m_backend.data._M_elems._48_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
  local_78.m_backend.data._M_elems._56_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
  local_78.m_backend.exp = (eps->m_backend).exp;
  local_78.m_backend.neg = (eps->m_backend).neg;
  local_78.m_backend.fpclass = (eps->m_backend).fpclass;
  local_78.m_backend.prec_elem = (eps->m_backend).prec_elem;
  initFactorMatrix(this,vec,&local_78);
  if (((this->stat == OK) && (colSingletons(this), this->stat == OK)) &&
     (rowSingletons(this), this->stat == OK)) {
    if ((this->temp).stage < this->thedim) {
      initFactorRings(this);
      local_c8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(eps->m_backend).data._M_elems;
      local_c8.m_backend.data._M_elems._8_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 2);
      local_c8.m_backend.data._M_elems._16_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 4);
      local_c8.m_backend.data._M_elems._24_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 6);
      local_c8.m_backend.data._M_elems._32_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 8);
      local_c8.m_backend.data._M_elems._40_8_ = *(undefined8 *)((eps->m_backend).data._M_elems + 10)
      ;
      local_c8.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xc);
      local_c8.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((eps->m_backend).data._M_elems + 0xe);
      local_c8.m_backend.exp = (eps->m_backend).exp;
      local_c8.m_backend.neg = (eps->m_backend).neg;
      local_c8.m_backend.fpclass = (eps->m_backend).fpclass;
      local_c8.m_backend.prec_elem = (eps->m_backend).prec_elem;
      local_118.m_backend.data._M_elems._0_8_ = *(undefined8 *)(threshold->m_backend).data._M_elems;
      local_118.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 2);
      local_118.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 4);
      local_118.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 6);
      local_118.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 8);
      local_118.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 10);
      local_118.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 0xc);
      local_118.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((threshold->m_backend).data._M_elems + 0xe);
      local_118.m_backend.exp = (threshold->m_backend).exp;
      local_118.m_backend.neg = (threshold->m_backend).neg;
      local_118.m_backend.fpclass = (threshold->m_backend).fpclass;
      local_118.m_backend.prec_elem = (threshold->m_backend).prec_elem;
      eliminateNucleus(this,&local_c8,&local_118);
      freeFactorRings(this);
      SVar1 = this->stat;
      (this->l).firstUpdate = (this->l).firstUnused;
      if (SVar1 != OK) goto LAB_0030f464;
    }
    else {
      (this->l).firstUpdate = (this->l).firstUnused;
    }
    setupRowVals(this);
    iVar2 = setupColVals(this);
    this->nzCnt = iVar2;
  }
  else {
    (this->l).firstUpdate = (this->l).firstUnused;
  }
LAB_0030f464:
  (*this->factorTime->_vptr_Timer[4])();
  this->factorCount = this->factorCount + 1;
  return;
}

Assistant:

void CLUFactor<R>::factor(const SVectorBase<R>**
                          vec,          ///< Array of column VectorBase<R> pointers
                          R            threshold,    ///< pivoting threshold
                          R            eps)          ///< epsilon for zero detection
{

   factorTime->start();

   this->stat = SLinSolver<R>::OK;

   l.start[0]    = 0;
   l.firstUpdate = 0;
   l.firstUnused = 0;

   temp.init(thedim);
   initPerm();

   initFactorMatrix(vec, eps);

   if(this->stat)
      goto TERMINATE;

   //   initMaxabs = initMaxabs;

   colSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   rowSingletons();

   if(this->stat != SLinSolver<R>::OK)
      goto TERMINATE;

   if(temp.stage < thedim)
   {
      initFactorRings();
      eliminateNucleus(eps, threshold);
      freeFactorRings();
   }

TERMINATE:

   l.firstUpdate = l.firstUnused;

   if(this->stat == SLinSolver<R>::OK)
   {
#ifdef SOPLEX_WITH_L_ROWS
      setupRowVals();
#endif
      nzCnt = setupColVals();
   }

   factorTime->stop();

   factorCount++;
}